

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::Constraint::Constraint(Constraint *this,size_t size,string *name)

{
  this->_vptr_Constraint = (_func_int **)&PTR__Constraint_001d3d58;
  this->m_constraintSize = size;
  std::__cxx11::string::string((string *)&this->m_constraintName,(string *)name);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_valueBuffer,size & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_lowerBound);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_upperBound);
  this->m_isLowerBounded = false;
  this->m_isUpperBounded = false;
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::resize((ulong)&this->m_lowerBound);
  iDynTree::VectorDynSize::resize((ulong)&this->m_upperBound);
  return;
}

Assistant:

Constraint::Constraint(size_t size, const std::string name)
        : m_constraintSize(size)
        , m_constraintName(name)
        , m_valueBuffer(static_cast<unsigned int>(size))
        , m_isLowerBounded(false)
        , m_isUpperBounded(false)
        {
            m_valueBuffer.zero();
            m_lowerBound.resize(static_cast<unsigned int>(size));
            m_upperBound.resize(static_cast<unsigned int>(size));
        }